

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O0

void CPU::WDC65816::ProcessorStorageConstructor::stack_per
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  function<void_(CPU::WDC65816::MicroOp)> *target_local;
  bool param_1_local;
  AccessType param_0_local;
  
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPreviousPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationConstructPER);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePushNotEmulation);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePushNotEmulation);
  return;
}

Assistant:

static void stack_per(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);			// Offset low.
		target(CycleFetchIncrementPC);			// Offset high.
		target(CycleFetchPreviousPCThrowaway);	// IO.

		target(OperationConstructPER);

		target(CyclePushNotEmulation);			// AAH.
		target(CyclePushNotEmulation);			// AAL.
	}